

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void outlet_bang(_outlet *x)

{
  _outconnect *p_Var1;
  
  if (stackcount < 999) {
    p_Var1 = (_outconnect *)&x->o_connections;
    stackcount = stackcount + 1;
    while (p_Var1 = p_Var1->oc_next, p_Var1 != (_outconnect *)0x0) {
      pd_bang(p_Var1->oc_to);
    }
  }
  else {
    stackcount = stackcount + 1;
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_bang(t_outlet *x)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        pd_bang(oc->oc_to);
    --stackcount;
}